

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O3

void __thiscall SimpleVendor::DispenseChange(SimpleVendor *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->super_Vendor).balance_;
  uVar2 = uVar1 - 5;
  if ((uVar1 & 1) == 0) {
    uVar2 = uVar1;
  }
  (*this->vio->_vptr_VendorIo[2])(this->vio,(ulong)uVar1,(ulong)(uint)((int)uVar2 / 10));
  (this->super_Vendor).balance_ = 0;
  return;
}

Assistant:

void SimpleVendor::DispenseChange() {
    int pending = GetBalance(), nickles = 0;

    if (pending & 1) { // checks if the amount pending is odd, i.e. we need to dispense a nickle
        nickles++;
        pending -= VALUE_NICKLE;
    }

    vio->PrintChange(GetBalance(), pending / VALUE_DIME, nickles);
    SetBalance(0);
}